

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void SetWindowIcon(Image image)

{
  GLFWimage local_18;
  
  if (image.data == (void *)0x0) {
    glfwSetWindowIcon(platform.handle,0,(GLFWimage *)0x0);
    return;
  }
  if (image.format == 7) {
    local_18.width = image.width;
    local_18.height = image.height;
    local_18.pixels = (uchar *)image.data;
    glfwSetWindowIcon(platform.handle,1,&local_18);
    return;
  }
  TraceLog(4,"GLFW: Window icon image must be in R8G8B8A8 pixel format");
  return;
}

Assistant:

void SetWindowIcon(Image image)
{
    if (image.data == NULL)
    {
        // Revert to the default window icon, pass in an empty image array
        glfwSetWindowIcon(platform.handle, 0, NULL);
    }
    else
    {
        if (image.format == PIXELFORMAT_UNCOMPRESSED_R8G8B8A8)
        {
            GLFWimage icon[1] = { 0 };

            icon[0].width = image.width;
            icon[0].height = image.height;
            icon[0].pixels = (unsigned char *)image.data;

            // NOTE 1: We only support one image icon
            // NOTE 2: The specified image data is copied before this function returns
            glfwSetWindowIcon(platform.handle, 1, icon);
        }
        else TRACELOG(LOG_WARNING, "GLFW: Window icon image must be in R8G8B8A8 pixel format");
    }
}